

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O3

string * __thiscall
json::JsonLexer::readExponent_abi_cxx11_
          (string *__return_storage_ptr__,JsonLexer *this,istream *input)

{
  long *plVar1;
  runtime_error *this_00;
  istream *input_00;
  char cVar2;
  char c;
  char local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::istream::get((char *)this);
  cVar2 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar2);
  plVar1 = (long *)std::istream::get((char *)this);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    if ((local_41 == '-') || (local_41 == '+')) {
      std::__cxx11::string::push_back(cVar2);
      plVar1 = (long *)std::istream::get((char *)this);
      if (((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) &&
         ((int)local_41 - 0x30U < 10)) {
LAB_00103fb0:
        std::__cxx11::string::push_back(cVar2);
        readDigits_abi_cxx11_(&local_40,this,input_00);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"After a minus or plus sign there must be at least one digit");
    }
    else {
      if ((int)local_41 - 0x30U < 10) goto LAB_00103fb0;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"A valid exponent requires at least one digit");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"A number cannot end with \'e\' or \'E\'");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string JsonLexer::readExponent(std::istream &input)
    {
        std::string exponent;
        char c;
        input.get(c);

        exponent += c; // We append 'e' or 'E'.

        if (!input.get(c))
            throw std::runtime_error("A number cannot end with 'e' or 'E'");

        if (c == '-' || c == '+')
        {
            exponent += c;
            if (!(input.get(c)) || !isdigit(c))
                throw std::runtime_error("After a minus or plus sign there must be at least one digit");
        }

        if (!isdigit(c))
            throw std::runtime_error("A valid exponent requires at least one digit");

        exponent += c;
        exponent += readDigits(input);
        return exponent;
    }